

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

int Curl_parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  bool bVar1;
  __uid_t __uid;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  bool local_18d;
  char local_188 [4];
  int netrcbuffsize;
  char netrcbuffer [256];
  _Bool done;
  char *tok_buf;
  char *tok;
  passwd *pw;
  char *home;
  int local_50;
  char local_4a;
  _Bool home_alloc;
  int state_our_login;
  char state_password;
  char state_login;
  host_lookup_state state;
  int iStack_3c;
  _Bool netrc_alloc;
  int specific_login;
  int retcode;
  FILE *file;
  char *netrcfile_local;
  char **passwordp_local;
  char **loginp_local;
  char *host_local;
  
  iStack_3c = 1;
  local_18d = false;
  if (*loginp != (char *)0x0) {
    local_18d = **loginp != '\0';
  }
  state = (host_lookup_state)local_18d;
  state_login = '\0';
  state_our_login = 0;
  home_alloc = false;
  local_4a = '\0';
  local_50 = 0;
  file = (FILE *)netrcfile;
  netrcfile_local = (char *)passwordp;
  passwordp_local = loginp;
  loginp_local = (char **)host;
  if (netrcfile == (char *)0x0) {
    home._7_1_ = 0;
    pw = (passwd *)curl_getenv("HOME");
    if (pw == (passwd *)0x0) {
      __uid = geteuid();
      tok = (char *)getpwuid(__uid);
      if ((passwd *)tok != (passwd *)0x0) {
        pw = (passwd *)((passwd *)tok)->pw_dir;
      }
    }
    else {
      home._7_1_ = 1;
    }
    if (pw == (passwd *)0x0) {
      return iStack_3c;
    }
    file = (FILE *)curl_maprintf("%s%s%s",pw,"/",".netrc");
    if (((home._7_1_ & 1) != 0) && (pw != (passwd *)0x0)) {
      (*Curl_cfree)(pw);
      pw = (passwd *)0x0;
    }
    if (file == (FILE *)0x0) {
      return -1;
    }
    state_login = '\x01';
  }
  _specific_login = fopen64((char *)file,"r");
  if (((state_login & 1U) != 0) && (file != (FILE *)0x0)) {
    (*Curl_cfree)(file);
    file = (FILE *)0x0;
  }
  if (_specific_login == (FILE *)0x0) {
    return iStack_3c;
  }
  bVar1 = false;
  do {
    bVar4 = false;
    if (!bVar1) {
      pcVar3 = fgets(local_188,0x100,_specific_login);
      bVar4 = pcVar3 != (char *)0x0;
    }
    if (!bVar4) {
LAB_008730d2:
      fclose(_specific_login);
      return iStack_3c;
    }
    tok_buf = strtok_r(local_188," \t\n",(char **)&stack0xffffffffffffff88);
    while (!bVar1 && tok_buf != (char *)0x0) {
      if ((((*passwordp_local != (char *)0x0) && (**passwordp_local != '\0')) &&
          (*(long *)netrcfile_local != 0)) && (**(char **)netrcfile_local != '\0')) {
        bVar1 = true;
        break;
      }
      if (state_our_login == 0) {
        iVar2 = Curl_raw_equal("machine",tok_buf);
        if (iVar2 != 0) {
          state_our_login = 1;
        }
      }
      else if (state_our_login == 1) {
        iVar2 = Curl_raw_equal((char *)loginp_local,tok_buf);
        if (iVar2 == 0) {
          state_our_login = 0;
        }
        else {
          state_our_login = 2;
          iStack_3c = 0;
        }
      }
      else if (state_our_login == 2) {
        if (home_alloc == false) {
          if (local_4a == '\0') {
            iVar2 = Curl_raw_equal("login",tok_buf);
            if (iVar2 == 0) {
              iVar2 = Curl_raw_equal("password",tok_buf);
              if (iVar2 == 0) {
                iVar2 = Curl_raw_equal("machine",tok_buf);
                if (iVar2 != 0) {
                  state_our_login = 1;
                  local_50 = 0;
                }
              }
              else {
                local_4a = '\x01';
              }
            }
            else {
              home_alloc = true;
            }
          }
          else {
            if ((local_50 != 0) || (state == NOTHING)) {
              (*Curl_cfree)(*(void **)netrcfile_local);
              pcVar3 = (*Curl_cstrdup)(tok_buf);
              *(char **)netrcfile_local = pcVar3;
              if (*(long *)netrcfile_local == 0) {
                iStack_3c = -1;
                goto LAB_008730d2;
              }
            }
            local_4a = '\0';
          }
        }
        else {
          if (state == NOTHING) {
            (*Curl_cfree)(*passwordp_local);
            pcVar3 = (*Curl_cstrdup)(tok_buf);
            *passwordp_local = pcVar3;
            if (*passwordp_local == (char *)0x0) {
              iStack_3c = -1;
              goto LAB_008730d2;
            }
          }
          else {
            local_50 = Curl_raw_equal(*passwordp_local,tok_buf);
          }
          home_alloc = false;
        }
      }
      tok_buf = strtok_r((char *)0x0," \t\n",(char **)&stack0xffffffffffffff88);
    }
  } while( true );
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char **loginp,
                    char **passwordp,
                    char *netrcfile)
{
  FILE *file;
  int retcode=1;
  int specific_login = (*loginp && **loginp != 0);
  bool netrc_alloc = FALSE;
  enum host_lookup_state state=NOTHING;

  char state_login=0;      /* Found a login keyword */
  char state_password=0;   /* Found a password keyword */
  int state_our_login=FALSE;  /* With specific_login, found *our* login name */

#define NETRC DOT_CHAR "netrc"

  if(!netrcfile) {
    bool home_alloc = FALSE;
    char *home = curl_getenv("HOME"); /* portable environment reader */
    if(home) {
      home_alloc = TRUE;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      char pwbuf[1024];
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = strdup(pw.pw_dir);
        if(!home)
          return CURLE_OUT_OF_MEMORY;
        home_alloc = TRUE;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw= getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of memory) */

    netrcfile = curl_maprintf("%s%s%s", home, DIR_CHAR, NETRC);
    if(home_alloc)
      Curl_safefree(home);
    if(!netrcfile) {
      return -1;
    }
    netrc_alloc = TRUE;
  }

  file = fopen(netrcfile, "r");
  if(netrc_alloc)
    Curl_safefree(netrcfile);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done=FALSE;
    char netrcbuffer[256];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok=strtok_r(netrcbuffer, " \t\n", &tok_buf);
      while(!done && tok) {

        if((*loginp && **loginp) && (*passwordp && **passwordp)) {
          done=TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(Curl_raw_equal("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state=HOSTFOUND;
          }
          break;
        case HOSTFOUND:
          if(Curl_raw_equal(host, tok)) {
            /* and yes, this is our host! */
            state=HOSTVALID;
            retcode=0; /* we did find our host */
          }
          else
            /* not our host */
            state=NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = Curl_raw_equal(*loginp, tok);
            }
            else {
              free(*loginp);
              *loginp = strdup(tok);
              if(!*loginp) {
                retcode = -1; /* allocation failed */
                goto out;
              }
            }
            state_login=0;
          }
          else if(state_password) {
            if(state_our_login || !specific_login) {
              free(*passwordp);
              *passwordp = strdup(tok);
              if(!*passwordp) {
                retcode = -1; /* allocation failed */
                goto out;
              }
            }
            state_password=0;
          }
          else if(Curl_raw_equal("login", tok))
            state_login=1;
          else if(Curl_raw_equal("password", tok))
            state_password=1;
          else if(Curl_raw_equal("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    fclose(file);
  }

  return retcode;
}